

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvascan.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  nva_regspace_type nVar3;
  nva_err err;
  nva_err err_00;
  int iVar4;
  nva_err nVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  uint uVar9;
  undefined8 uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  int32_t a;
  int32_t b;
  nva_regspace rs;
  uint64_t x;
  uint64_t z;
  uint64_t y;
  uint64_t ch;
  uint64_t sv;
  int local_b0;
  char local_a9;
  int local_a8;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  nva_regspace local_98;
  int local_74;
  uint64_t local_70;
  uint64_t local_68;
  uint local_5c;
  nva_err local_58;
  int local_54;
  ulong local_50;
  undefined8 local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  iVar2 = nva_init();
  if (iVar2 != 0) {
    main_cold_1();
    return 1;
  }
  local_98.card = (nva_card *)0x0;
  local_98.cnum = 0;
  local_98.type = NVA_REGSPACE_BAR0;
  local_98.regsz = 0;
  local_98.idx = 0;
  local_a8 = 0;
  local_74 = 0;
switchD_00102675_caseD_64:
  while (iVar2 = getopt(argc,argv,"asc:i:b:t:"), 0x72 < iVar2) {
    if (iVar2 == 0x73) {
      local_a8 = 1;
    }
    else if (iVar2 == 0x74) {
      nVar3 = nva_rstype(_optarg);
      local_98.type = nVar3;
      if (nVar3 == NVA_REGSPACE_UNKNOWN) {
        main_cold_2();
        return 1;
      }
    }
  }
  switch(iVar2) {
  case 0x61:
    local_74 = 1;
    goto switchD_00102675_caseD_64;
  case 0x62:
    __isoc99_sscanf(_optarg,"%d",&local_98.regsz);
    if ((8 < (uint)local_98.regsz) || ((0x116U >> (local_98.regsz & 0x1fU) & 1) == 0)) {
      main_cold_3();
      return 1;
    }
    goto switchD_00102675_caseD_64;
  case 99:
    piVar8 = &local_98.cnum;
    break;
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
    goto switchD_00102675_caseD_64;
  case 0x69:
    piVar8 = &local_98.idx;
    break;
  default:
    if (iVar2 == -1) {
      if (nva_cardsnum <= local_98.cnum) {
        if (nva_cardsnum != 0) {
          main_cold_4();
          return 1;
        }
        main_cold_5();
        return 1;
      }
      local_98.card = nva_cards[local_98.cnum];
      if (local_98.regsz == 0) {
        iVar2 = nva_rsdefsz(&local_98);
        local_98.regsz = iVar2;
      }
      local_54 = nva_rsunitsz(&local_98);
      iVar2 = local_a8;
      local_9c = local_98.regsz / local_54;
      if (argc <= _optind) {
        main_cold_6();
        return 1;
      }
      __isoc99_sscanf(argv[_optind],"%x",&local_b0);
      if (_optind + 1 < argc) {
        __isoc99_sscanf(argv[(long)_optind + 1],"%x",&local_9c);
      }
      if (local_9c < 1) {
        return 0;
      }
      iVar4 = 1;
      iVar11 = 0;
      do {
        local_a0 = iVar4;
        err = nva_rd(&local_98,local_b0 + iVar11,&local_70);
        uVar10 = 0;
        err_00 = NVA_ERR_SUCCESS;
        bVar12 = false;
        nVar5 = NVA_ERR_SUCCESS;
        bVar13 = false;
        if (err == NVA_ERR_SUCCESS) {
          iVar2 = nva_wr(&local_98,local_b0 + iVar11,0xffffffffffffffff);
          err_00 = nva_rd(&local_98,local_b0 + iVar11,&local_50);
          iVar4 = nva_wr(&local_98,local_b0 + iVar11,0);
          nVar5 = nva_rd(&local_98,local_b0 + iVar11,&local_68);
          iVar6 = nva_wr(&local_98,local_b0 + iVar11,local_70);
          bVar12 = iVar4 != 0;
          bVar13 = iVar6 != 0;
          uVar10 = CONCAT71((int7)((ulong)uVar10 >> 8),(iVar2 != 0 || iVar4 != 0) || iVar6 != 0);
          iVar2 = local_a8;
        }
        if ((bool)(local_68 != 0 | local_50 != 0 | local_70 != 0 | bVar12 | bVar13 |
                  (((err_00 != NVA_ERR_SUCCESS || nVar5 != NVA_ERR_SUCCESS) ||
                   err != NVA_ERR_SUCCESS) || err_00 != NVA_ERR_SUCCESS))) {
          if (err == NVA_ERR_SUCCESS) {
            uVar7 = local_70 ^ local_50;
            local_a9 = local_68 != local_50 || uVar7 != 0;
            local_58 = nVar5;
            local_48 = uVar10;
            if (local_74 == 0 || local_68 == local_50 && uVar7 == 0) {
              local_a4 = (undefined4)CONCAT71((int7)(uVar7 >> 8),1);
            }
            else {
              iVar4 = nva_wr(&local_98,local_b0 + iVar11,0xffffffffffffffff);
              local_a4 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
              if (0 < iVar11) {
                iVar4 = 0;
                do {
                  iVar2 = nva_rd(&local_98,local_b0 + iVar4,&local_38);
                  if (iVar2 == 0) {
                    local_a0 = nva_wr(&local_98,local_b0 + iVar4,0);
                    iVar2 = nva_rd(&local_98,local_b0 + iVar11,&local_40);
                    iVar6 = nva_wr(&local_98,local_b0 + iVar4,local_38);
                    if ((local_40 == local_68) && ((iVar2 == 0 && local_a0 == 0) && iVar6 == 0)) {
                      local_5c = iVar4 + local_b0;
                      local_a4 = 0;
                      iVar2 = local_a8;
                      break;
                    }
                  }
                  iVar4 = iVar4 + 4;
                  iVar2 = local_a8;
                } while (iVar4 < iVar11);
              }
              nva_wr(&local_98,local_b0 + iVar11,local_70);
            }
            printf("%06x:");
            nva_rsprint(&local_98,NVA_ERR_SUCCESS,local_70);
            nva_rsprint(&local_98,err_00,local_50);
            nva_rsprint(&local_98,local_58,local_68);
            if ((char)local_48 != '\0') {
              printf(" WERR");
            }
            if (local_a9 != '\0') {
              printf(" *");
            }
            if ((char)local_a4 == '\0') {
              printf(" ALIASES %06x",(ulong)local_5c);
            }
            putchar(10);
          }
          else {
            uVar9 = local_b0 + iVar11;
            cVar1 = nva_rserrc(err);
            printf("%06x: %c\n",(ulong)uVar9,(ulong)(uint)(int)cVar1);
          }
          iVar4 = 1;
        }
        else {
          if (local_a0 != 0) {
            puts("...");
          }
          iVar4 = 0;
        }
        if (iVar2 != 0) {
          iVar6 = 100;
          do {
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          usleep(10000);
          iVar6 = 100;
          do {
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
        iVar11 = iVar11 + local_98.regsz / local_54;
        if (local_9c <= iVar11) {
          return 0;
        }
      } while( true );
    }
    goto switchD_00102675_caseD_64;
  }
  __isoc99_sscanf(_optarg,"%d",piVar8);
  goto switchD_00102675_caseD_64;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int alias = 0;
	int slow = 0;
	int c;
	struct nva_regspace rs = { 0 };
	while ((c = getopt (argc, argv, "asc:i:b:t:")) != -1)
		switch (c) {
			case 'a':
				alias = 1;
				break;
			case 's':
				slow = 1;
				break;
			case 'c':
				sscanf(optarg, "%d", &rs.cnum);
				break;
			case 'i':
				sscanf(optarg, "%d", &rs.idx);
				break;
			case 'b':
				sscanf(optarg, "%d", &rs.regsz);
				if (rs.regsz != 1 && rs.regsz != 2 && rs.regsz != 4 && rs.regsz != 8) {
					fprintf (stderr, "Invalid size.\n");
					return 1;
				}
				break;
			case 't':
				rs.type = nva_rstype(optarg);
				if (rs.type == NVA_REGSPACE_UNKNOWN) {
					fprintf (stderr, "Unknown register space.\n");
					return 1;
				}
				break;
		}
	if (rs.cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	rs.card = nva_cards[rs.cnum];
	if (rs.regsz == 0)
		rs.regsz = nva_rsdefsz(&rs);
	int unit = nva_rsunitsz(&rs);
	int32_t a, b = rs.regsz/unit, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	for (i = 0; i < b; i+=rs.regsz/unit) {
		uint64_t x, y, z;
		int ex = nva_rd(&rs, a+i, &x);
		int ew = 0, ey = 0, ev = 0, ez = 0, eb = 0;
		if (!ex) {
			ew = nva_wr(&rs, a+i, -1ll);
			ey = nva_rd(&rs, a+i, &y);
			ev = nva_wr(&rs, a+i, 0);
			ez = nva_rd(&rs, a+i, &z);
			eb = nva_wr(&rs, a+i, x);
		}
		if (ex || ey || ez || ey || ev || eb || x || y || z) {
			if (ex) {
				printf ("%06x: %c\n", a+i, nva_rserrc(ex));
			} else {
				int cool = (x != y) || (y != z);
				int isalias = 0, areg;
				if (cool && alias) {
					int j;
					nva_wr(&rs, a+i, -1ll);
					for (j = 0; j < i; j+=4) {
						uint64_t sv;
						uint64_t ch;
						int es = nva_rd(&rs, a+j, &sv);
						if (!es) {
							es |= nva_wr(&rs, a+j, 0);
							es |= nva_rd(&rs, a+i, &ch);
							es |= nva_wr(&rs, a+j, sv);
							if (ch == z && !es) {
								areg = a + j;
								isalias = 1;
								break;
							}
						}
					}
					nva_wr(&rs, a+i, x);
				}
				printf ("%06x:", a+i);
				nva_rsprint(&rs, ex, x);
				nva_rsprint(&rs, ey, y);
				nva_rsprint(&rs, ez, z);
				if (ew || ev || eb)
					printf(" WERR");
				if (cool)
					printf(" *");
				if (isalias) {
					printf(" ALIASES %06x", areg);
				}
				printf("\n");
			}
			ls = 1;
		} else {
			if (ls)
				printf("...\n");
			ls = 0;
		}
		if (slow) {
			int j;
			for (j = 0; j < 100; j++)
				nva_rd32(rs.cnum, 0);
			usleep(10000);
			for (j = 0; j < 100; j++)
				nva_rd32(rs.cnum, 0);
		}
	}
	return 0;
}